

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

void __thiscall CLI::App::App(App *this,string *app_description,string *app_name)

{
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string local_60;
  string local_40;
  string *local_20;
  string *app_name_local;
  string *app_description_local;
  App *this_local;
  
  local_20 = app_name;
  app_name_local = app_description;
  app_description_local = (string *)this;
  ::std::__cxx11::string::string
            ((string *)&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)app_description);
  ::std::__cxx11::string::string
            ((string *)&local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)app_name);
  App(this,&local_40,&local_60,(App *)0x0);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"-h,--help",&local_91);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Print this help message and exit",&local_b9);
  set_help_flag(this,&local_90,&local_b8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::allocator<char>::~allocator(&local_b9);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::allocator<char>::~allocator(&local_91);
  return;
}

Assistant:

explicit App(std::string app_description = "", std::string app_name = "")
        : App(app_description, app_name, nullptr) {
        set_help_flag("-h,--help", "Print this help message and exit");
    }